

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall HighsCliqueTable::resolveSubstitution(HighsCliqueTable *this,CliqueVar *v)

{
  int iVar1;
  Substitution SVar2;
  CliqueVar CVar3;
  
  CVar3 = *v;
  iVar1 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(uint)CVar3 & 0x7fffffff];
  while (iVar1 != 0) {
    SVar2 = (this->substitutions).
            super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)iVar1 + -1];
    CVar3 = (CliqueVar)((uint)CVar3 & 0x80000000 ^ 0x80000000 ^ (uint)SVar2.replace);
    *v = CVar3;
    iVar1 = *(int *)((long)(this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                    ((ulong)SVar2 >> 0x1e & 0x1fffffffc));
  }
  return;
}

Assistant:

void HighsCliqueTable::resolveSubstitution(CliqueVar& v) const {
  while (colsubstituted[v.col]) {
    Substitution subst = substitutions[colsubstituted[v.col] - 1];
    v = v.val == 1 ? subst.replace : subst.replace.complement();
  }
}